

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_collectargs(ASMState *as,IRIns *ir,CCallInfo *ci,IRRef *args)

{
  uint local_34;
  uint local_30;
  uint local_2c;
  IRRef *pIStack_28;
  uint32_t n;
  IRRef *args_local;
  CCallInfo *ci_local;
  IRIns *ir_local;
  ASMState *as_local;
  
  local_2c = ci->flags & 0xff;
  ci_local = (CCallInfo *)ir;
  pIStack_28 = args;
  if ((ci->flags & 0x100) != 0) {
    pIStack_28 = args + 1;
    *args = 0x7fff;
    local_2c = local_2c - 1;
  }
  while (1 < local_2c) {
    ci_local = (CCallInfo *)(as->ir + *(ushort *)&ci_local->func);
    if (((anon_struct_8_4_c535eab0_for_IRIns_0 *)ci_local)->op2 == 0x7fff) {
      local_30 = 0;
    }
    else {
      local_30 = (uint)((anon_struct_8_4_c535eab0_for_IRIns_0 *)ci_local)->op2;
    }
    pIStack_28[local_2c - 1] = local_30;
    local_2c = local_2c - 1;
  }
  if (*(short *)&ci_local->func == 0x7fff) {
    local_34 = 0;
  }
  else {
    local_34 = (uint)*(ushort *)&ci_local->func;
  }
  *pIStack_28 = local_34;
  return;
}

Assistant:

static void asm_collectargs(ASMState *as, IRIns *ir,
			    const CCallInfo *ci, IRRef *args)
{
  uint32_t n = CCI_XNARGS(ci);
  /* Account for split args. */
  lj_assertA(n <= CCI_NARGS_MAX*2, "too many args %d to collect", n);
  if ((ci->flags & CCI_L)) { *args++ = ASMREF_L; n--; }
  while (n-- > 1) {
    ir = IR(ir->op1);
    lj_assertA(ir->o == IR_CARG, "malformed CALL arg tree");
    args[n] = ir->op2 == REF_NIL ? 0 : ir->op2;
  }
  args[0] = ir->op1 == REF_NIL ? 0 : ir->op1;
  lj_assertA(IR(ir->op1)->o != IR_CARG, "malformed CALL arg tree");
}